

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O3

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer puVar3;
  stored_size_type sVar4;
  pointer ppVar5;
  pointer pdVar6;
  stored_size_type *psVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint *puVar13;
  uint *puVar14;
  long lVar15;
  size_type __new_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pfVar1 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  lVar9 = (long)(A->
                super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar9 == 0) {
    __new_size = 0;
  }
  else {
    lVar9 = (lVar9 >> 3) * -0x5555555555555555;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    psVar7 = (stored_size_type *)((long)&(pfVar1->m_flat_tree).m_data.m_seq + 8);
    __new_size = 0;
    do {
      __new_size = __new_size + *psVar7;
      psVar7 = psVar7 + 3;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(B_cols,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(B_values,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (B_rows,((long)(A->
                           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(A->
                           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    1);
  pfVar1 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pfVar2 - (long)pfVar1 >> 3;
  lVar8 = lVar9 * -0x5555555555555555;
  puVar3 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != pfVar1) {
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    lVar12 = 0;
    do {
      sVar4 = pfVar1[lVar12].m_flat_tree.m_data.m_seq.m_holder.m_size;
      if (sVar4 != 0) {
        ppVar5 = pfVar1[lVar12].m_flat_tree.m_data.m_seq.m_holder.m_start;
        lVar15 = 0;
        do {
          puVar3[*(uint *)((long)&ppVar5->first + lVar15)] =
               puVar3[*(uint *)((long)&ppVar5->first + lVar15)] + 1;
          lVar15 = lVar15 + 0x10;
        } while (sVar4 << 4 != lVar15);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar8);
    if (pfVar2 == pfVar1) {
      uVar10 = 0;
    }
    else {
      lVar12 = 0;
      uVar11 = 0;
      do {
        uVar10 = puVar3[lVar12] + uVar11;
        puVar3[lVar12] = uVar11;
        lVar12 = lVar12 + 1;
        uVar11 = uVar10;
      } while (lVar8 != lVar12);
    }
  }
  puVar3[lVar9 * -0x1555555555555555] = uVar10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,B_rows);
  pfVar1 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(A->
                super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar9 != 0) {
    lVar9 = (lVar9 >> 3) * -0x5555555555555555;
    puVar3 = (B_cols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (B_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      sVar4 = *(stored_size_type *)((long)&pfVar1[lVar8].m_flat_tree.m_data.m_seq + 8);
      if (sVar4 != 0) {
        puVar14 = *(uint **)&pfVar1[lVar8].m_flat_tree.m_data.m_seq;
        puVar13 = puVar14 + sVar4 * 4;
        do {
          uVar10 = *puVar14;
          uVar11 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
          puVar3[uVar11] = (uint)lVar8;
          pdVar6[uVar11] = *(double *)(puVar14 + 2);
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] + 1;
          puVar14 = puVar14 + 4;
        } while (puVar14 != puVar13);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar9 + (ulong)(lVar9 == 0));
  }
  do_nothing(B_rows,B_cols,B_values);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}